

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transactions.cpp
# Opt level: O0

RPCHelpMan * wallet::abortrescan(void)

{
  long lVar1;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  RPCExamples *in_stack_fffffffffffffbd8;
  RPCResult *this;
  anon_class_1_0_00000001 *in_stack_fffffffffffffbe0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbe8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbf0;
  string *in_stack_fffffffffffffc08;
  string *args;
  string *in_stack_fffffffffffffc10;
  string *methodname;
  allocator<char> *in_stack_fffffffffffffc18;
  allocator<char> *paVar2;
  char *in_stack_fffffffffffffc20;
  allocator<char> *paVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  undefined1 skip_type_check;
  RPCHelpMan *result;
  RPCResult *in_stack_fffffffffffffc60;
  undefined1 local_380 [35];
  allocator<char> local_35d;
  undefined1 local_35c;
  undefined1 local_35b [2];
  allocator<char> local_359;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  allocator<char> local_332;
  allocator<char> local_331 [25];
  _Alloc_hider local_318;
  size_type sStack_310;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_308;
  allocator<char> local_2f2;
  allocator<char> local_2f1 [17];
  RPCExamples *in_stack_fffffffffffffd20;
  RPCResults *in_stack_fffffffffffffd28;
  vector<RPCArg,_std::allocator<RPCArg>_> *in_stack_fffffffffffffd30;
  string *in_stack_fffffffffffffd38;
  string *in_stack_fffffffffffffd40;
  RPCHelpMan *in_stack_fffffffffffffd48;
  RPCMethodImpl *in_stack_fffffffffffffe40;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  paVar3 = local_2f1;
  result = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc28,in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
  paVar2 = &local_2f2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc28,in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
  local_318._M_p = (pointer)0x0;
  sStack_310 = 0;
  local_308._M_allocated_capacity = 0;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffffbd8);
  skip_type_check = (undefined1)((ulong)local_331 >> 0x38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc28,in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc28,in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
  local_358._M_dataplus._M_p = (pointer)0x0;
  local_358._M_string_length = 0;
  local_358.field_2._M_allocated_capacity = 0;
  this_00 = &local_358;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffffbd8);
  RPCResult::RPCResult
            (in_stack_fffffffffffffc60,(Type)((ulong)paVar3 >> 0x20),&result->m_name,&in_RDI->m_name
             ,(vector<RPCResult,_std::allocator<RPCResult>_> *)paVar2,(bool)skip_type_check);
  RPCResults::RPCResults((RPCResults *)paVar3,(RPCResult *)result);
  paVar3 = &local_359;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_00,(char *)paVar3,in_stack_fffffffffffffc18);
  paVar2 = (allocator<char> *)(local_35b + 1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)paVar3,paVar2);
  HelpExampleCli(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
  std::operator+((char *)in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
  std::operator+(in_stack_fffffffffffffbf0,(char *)in_stack_fffffffffffffbe8);
  methodname = (string *)local_35b;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)paVar3,paVar2);
  args = (string *)&local_35c;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)paVar3,paVar2);
  HelpExampleCli(methodname,args);
  std::operator+(methodname,args);
  std::operator+(in_stack_fffffffffffffbf0,(char *)in_stack_fffffffffffffbe8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)paVar3,paVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)paVar3,paVar2);
  HelpExampleRpc(methodname,args);
  std::operator+(methodname,args);
  RPCExamples::RPCExamples(in_stack_fffffffffffffbd8,(string *)0x1871523);
  this = (RPCResult *)local_380;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<wallet::abortrescan()::__0,void>
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)
             in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0);
  RPCHelpMan::RPCHelpMan
            (in_stack_fffffffffffffd48,in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
             in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,in_stack_fffffffffffffd20,
             in_stack_fffffffffffffe40);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this);
  RPCExamples::~RPCExamples((RPCExamples *)this);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator((allocator<char> *)(local_380 + 0x22));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_35d);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator((allocator<char> *)&local_35c);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator((allocator<char> *)local_35b);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator((allocator<char> *)(local_35b + 1));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_359);
  RPCResults::~RPCResults((RPCResults *)this);
  RPCResult::~RPCResult(this);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffffbe8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_332);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(local_331);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffffbe8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_2f2);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(local_2f1);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return result;
  }
  __stack_chk_fail();
}

Assistant:

RPCHelpMan abortrescan()
{
    return RPCHelpMan{"abortrescan",
                "\nStops current wallet rescan triggered by an RPC call, e.g. by an importprivkey call.\n"
                "Note: Use \"getwalletinfo\" to query the scanning progress.\n",
                {},
                RPCResult{RPCResult::Type::BOOL, "", "Whether the abort was successful"},
                RPCExamples{
            "\nImport a private key\n"
            + HelpExampleCli("importprivkey", "\"mykey\"") +
            "\nAbort the running wallet rescan\n"
            + HelpExampleCli("abortrescan", "") +
            "\nAs a JSON-RPC call\n"
            + HelpExampleRpc("abortrescan", "")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    std::shared_ptr<CWallet> const pwallet = GetWalletForJSONRPCRequest(request);
    if (!pwallet) return UniValue::VNULL;

    if (!pwallet->IsScanning() || pwallet->IsAbortingRescan()) return false;
    pwallet->AbortRescan();
    return true;
},
    };
}